

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Value * __thiscall Am_Object::Get(Am_Object *this,Am_Slot_Key key,Am_Slot_Flags flags)

{
  Am_Object_Data *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Am_Value *pAVar3;
  
  pAVar1 = this->data;
  if ((pAVar1 == (Am_Object_Data *)0x0) || ((pAVar1->data).data == (char *)0x0)) {
    iVar2 = (*cc->_vptr_Am_Constraint_Context[5])
                      (cc,&Get_On_Null_Object_Value,this,(ulong)key,flags,
                       "Get called on (0L) object");
    return (Am_Value *)CONCAT44(extraout_var_01,iVar2);
  }
  if ((short)pAVar1->demons_active < 0) {
    Am_Demon_Queue::Invoke(&pAVar1->demon_queue);
  }
  iVar2 = (*cc->_vptr_Am_Constraint_Context[1])(cc,this,(ulong)key,flags);
  pAVar3 = (Am_Value *)CONCAT44(extraout_var,iVar2);
  if ((pAVar3->type & 0x7000) == 0x1000) {
    iVar2 = (*cc->_vptr_Am_Constraint_Context[5])(cc,pAVar3,this,(ulong)key,flags,0);
    return (Am_Value *)CONCAT44(extraout_var_00,iVar2);
  }
  return pAVar3;
}

Assistant:

const Am_Value &
Am_Object::Get(Am_Slot_Key key, Am_Slot_Flags flags) const
{
  // *** IF YOU MODIFY THIS METHOD, be sure to modify Get(Am_Slot_Key key), which specializes it

  if (!data || !data->data.data)
    return cc->Raise_Get_Exception(Get_On_Null_Object_Value,
                                   (const Am_Object_Advanced &)*this, key,
                                   flags, "Get called on (0L) object");

  if (data->demons_active & DEMONS_ACTIVE)
    data->demon_queue.Invoke();

  const Am_Value &value =
      cc->Get((const Am_Object_Advanced &)*this, key, flags);

  if (Am_Type_Class(value.type) == Am_ERROR_VALUE_TYPE)
    return cc->Raise_Get_Exception(value, (const Am_Object_Advanced &)*this,
                                   key, flags, nullptr);
#ifdef DEBUG
  Am_Value v = value; // type-check error in VC++
  Global_Check_Get_Method_Trace(*this, key, v);
#endif
  return value;
}